

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O1

Error __thiscall
asmjit::v1_14::RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder>::shareAssignmentAcrossSuccessors
          (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *this,RABlock *block)

{
  StringTmp<512UL> *this_00;
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  BaseRAPass *pBVar5;
  Error EVar6;
  Error EVar7;
  undefined8 in_RAX;
  int iVar8;
  char *str;
  uint extraout_EDX;
  undefined1 *puVar9;
  ulong uVar10;
  RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *node;
  RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *successor;
  RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *this_01;
  RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *pRVar11;
  long lVar12;
  RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *pRVar13;
  long lVar14;
  uint32_t sharedAssignmentId;
  undefined8 local_38;
  
  uVar1 = *(uint *)(block + 0x70);
  if (1 < (ulong)uVar1) {
    if (((byte)block[0xd] & 2) == 0) {
      lVar12 = 0;
    }
    else {
      lVar12 = **(long **)(block + 0x68);
    }
    local_38._4_4_ = (Error)((ulong)in_RAX >> 0x20);
    local_38 = CONCAT44(local_38._4_4_,0xffffffff);
    lVar3 = *(long *)(block + 0x68);
    lVar14 = 0;
    this_01 = this;
    do {
      node = (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *)0xffffffff;
      lVar4 = *(long *)(lVar3 + lVar14);
      if (lVar4 == lVar12) {
        iVar8 = 3;
      }
      else {
        uVar2 = *(uint *)(lVar4 + 0xb8);
        str = (char *)(local_38 & 0xffffffff);
        if ((ulong)uVar2 == 0xffffffff) {
          if ((uint32_t)local_38 == 0xffffffff) {
            this_01 = this;
            EVar6 = newSharedAssignmentId(this,(uint32_t *)&local_38);
            iVar8 = 1;
            EVar7 = local_38._4_4_;
            if (EVar6 != 0) {
              EVar7 = EVar6;
            }
            local_38 = CONCAT44(EVar7,(uint32_t)local_38);
            if (EVar6 != 0) goto LAB_0014d0b6;
          }
          *(uint32_t *)(lVar4 + 0xb8) = (uint32_t)local_38;
        }
        else if ((uint32_t)local_38 == 0xffffffff) {
          local_38 = CONCAT44(local_38._4_4_,uVar2);
        }
        else {
          if (*(uint *)&this->field_0x38 <= uVar2) {
            shareAssignmentAcrossSuccessors();
            pBVar5 = this_01->_pass;
            uVar1 = *(uint *)&pBVar5->field_0xb8;
            if (((ulong)node->_cc & 0x20000000000) == 0) {
              pRVar13 = (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *)0x0;
            }
            else {
              if (*(int *)&node->field_0x70 == 0) goto LAB_0014d19a;
              pRVar13 = (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *)
                        **(undefined8 **)&node->_sb;
            }
            if (1 < uVar1) {
              uVar10 = 1;
              successor = node;
              pRVar11 = this_01;
              do {
                if (*(uint *)&pBVar5->field_0xb8 <= uVar10) {
                  handleBlockWithUnknownJump();
                  node = successor;
                  this_01 = pRVar11;
LAB_0014d19a:
                  handleBlockWithUnknownJump();
                  this_00 = &this_01->_sb;
                  String::clear((String *)this_00);
                  String::_opChars((String *)this_00,kAppend,' ',(ulong)extraout_EDX);
                  if (str != (char *)0x0) {
                    String::_opString((String *)this_00,kAppend,str,0xffffffffffffffff);
                    String::_opChar((String *)this_00,kAppend,' ');
                  }
                  Formatter::formatNode
                            ((String *)this_00,&this_01->_formatOptions,
                             &this_01->_cc->super_BaseBuilder,(BaseNode *)node);
                  String::_opChar((String *)this_00,kAppend,'\n');
                  uVar10 = (ulong)(byte)this_01->_sb;
                  if (uVar10 < 0x1f) {
                    puVar9 = &this_01->field_0x69;
                  }
                  else {
                    uVar10 = *(ulong *)&this_01->field_0x70;
                    puVar9 = *(undefined1 **)&this_01->field_0x80;
                  }
                  EVar7 = (*this_01->_logger->_vptr_Logger[2])(this_01->_logger,puVar9,uVar10);
                  return EVar7;
                }
                successor = *(RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> **)
                             (*(long *)&pBVar5->_blocks + uVar10 * 8);
                if ((successor != pRVar13) && (((ulong)successor->_cc & 0x400000000) != 0)) {
                  pRVar11 = node;
                  RABlock::appendSuccessor((RABlock *)node,(RABlock *)successor);
                }
                uVar10 = uVar10 + 1;
              } while (uVar1 != uVar10);
            }
            EVar7 = shareAssignmentAcrossSuccessors(this_01,(RABlock *)node);
            return EVar7;
          }
          *(uint32_t *)(*(long *)&this->_sharedAssignmentsMap + (ulong)uVar2 * 4) =
               (uint32_t)local_38;
        }
        iVar8 = 0;
      }
LAB_0014d0b6:
      if ((iVar8 != 3) && (iVar8 != 0)) {
        return local_38._4_4_;
      }
      lVar14 = lVar14 + 8;
    } while ((ulong)uVar1 << 3 != lVar14);
  }
  return 0;
}

Assistant:

Error shareAssignmentAcrossSuccessors(RABlock* block) noexcept {
    if (block->successors().size() <= 1)
      return kErrorOk;

    RABlock* consecutive = block->consecutive();
    uint32_t sharedAssignmentId = Globals::kInvalidId;

    for (RABlock* successor : block->successors()) {
      if (successor == consecutive)
        continue;

      if (successor->hasSharedAssignmentId()) {
        if (sharedAssignmentId == Globals::kInvalidId)
          sharedAssignmentId = successor->sharedAssignmentId();
        else
          _sharedAssignmentsMap[successor->sharedAssignmentId()] = sharedAssignmentId;
      }
      else {
        if (sharedAssignmentId == Globals::kInvalidId)
          ASMJIT_PROPAGATE(newSharedAssignmentId(&sharedAssignmentId));
        successor->setSharedAssignmentId(sharedAssignmentId);
      }
    }
    return kErrorOk;
  }